

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_suite.cpp
# Opt level: O0

void uvector_suite::test_single(void)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> **ppvVar1;
  iterator iVar2;
  iterator iVar3;
  size_t __n;
  void *__buf;
  undefined1 local_49;
  undefined1 local_48 [7];
  uchar expected [1];
  char *msg;
  undefined1 local_30 [8];
  vector_buffer<unsigned_char,_trial::protocol::buffer::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  container;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  
  ppvVar1 = &container.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.buffer;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppvVar1);
  vector_buffer<unsigned_char,_trial::protocol::buffer::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::vector_buffer((vector_buffer<unsigned_char,_trial::protocol::buffer::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_30,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppvVar1);
  msg._2_1_ = vector_buffer<unsigned_char,_trial::protocol::buffer::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::grow((vector_buffer<unsigned_char,_trial::protocol::buffer::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_30,1);
  msg._1_1_ = 1;
  __n = 0x7d;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("container.grow(1)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/vector_suite.cpp"
             ,0x7d,"void uvector_suite::test_single()",(long)&msg + 2,(long)&msg + 1);
  vector_buffer<unsigned_char,_trial::protocol::buffer::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::write((vector_buffer<unsigned_char,_trial::protocol::buffer::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           *)local_30,0x41,__buf,__n);
  local_49 = 0x41;
  ppvVar1 = &container.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.buffer;
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppvVar1);
  iVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppvVar1);
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/vector_suite.cpp"
             ,0x83,"void uvector_suite::test_single()",iVar2._M_current,iVar3._M_current,&local_49,
             local_48);
  vector_buffer<unsigned_char,_trial::protocol::buffer::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~vector_buffer((vector_buffer<unsigned_char,_trial::protocol::buffer::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &container.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.buffer);
  return;
}

Assistant:

void test_single()
{
    std::vector<unsigned char> output;
    vector_buffer<unsigned char> container(output);
    TRIAL_PROTOCOL_TEST_EQUAL(container.grow(1), true);
    TRIAL_PROTOCOL_TEST_NO_THROW(container.write('A'));

    unsigned char expected[] = { 'A' };
    TRIAL_PROTOCOL_TEST_ALL_WITH(output.begin(), output.end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<unsigned char>());
}